

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

void __thiscall cmDebugger_impl::ClearListeners(cmDebugger_impl *this)

{
  bool bVar1;
  reference ppcVar2;
  cmDebuggerListener **s;
  iterator __end1;
  iterator __begin1;
  set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
  *__range1;
  cmDebugger_impl *this_local;
  
  __end1 = std::
           set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
           ::begin(&this->listeners);
  s = (cmDebuggerListener **)
      std::
      set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
      ::end(&this->listeners);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&s);
    if (!bVar1) break;
    ppcVar2 = std::_Rb_tree_const_iterator<cmDebuggerListener_*>::operator*(&__end1);
    if (*ppcVar2 != (cmDebuggerListener *)0x0) {
      (*(*ppcVar2)->_vptr_cmDebuggerListener[1])();
    }
    std::_Rb_tree_const_iterator<cmDebuggerListener_*>::operator++(&__end1);
  }
  std::
  set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
  ::clear(&this->listeners);
  return;
}

Assistant:

void ClearListeners() override
  {
    for (auto& s : listeners) {
      delete s;
    }
    listeners.clear();
  }